

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O1

Loop * __thiscall
spvtools::opt::LoopUtils::CloneLoop
          (LoopUtils *this,LoopCloningResult *cloning_result,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *ordered_loop_blocks)

{
  IRContext *pIVar1;
  BasicBlock *this_00;
  Loop *pLVar2;
  Instruction *this_01;
  pointer pOVar3;
  uint **ppuVar4;
  InstructionList *pIVar5;
  BasicBlock *pBVar6;
  LoopUtils *pLVar7;
  bool bVar8;
  char cVar9;
  PodType PVar10;
  uint32_t uVar11;
  mapped_type *ppBVar12;
  mapped_type *ppBVar13;
  mapped_type *pmVar14;
  size_type sVar15;
  mapped_type *ppIVar16;
  pointer puVar17;
  uint **ppuVar18;
  Instruction **ppIVar19;
  pointer pOVar20;
  Instruction *pIVar21;
  uint32_t uVar22;
  BasicBlock *new_bb;
  string message;
  BasicBlock *local_e0;
  undefined1 local_d8 [24];
  code *pcStack_c0;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_b8;
  LoopUtils *local_b0;
  BasicBlock *local_a8;
  LoopCloningResult *local_a0;
  spv_position_t local_98;
  code *pcStack_80;
  pointer local_70;
  pointer local_68;
  DefUseManager *local_60;
  Loop *local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  CFG *local_38;
  
  pIVar1 = this->context_;
  local_b0 = this;
  local_a0 = cloning_result;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  local_60 = (pIVar1->def_use_mgr_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_58 = (Loop *)operator_new(0x90);
  pIVar1 = local_b0->context_;
  local_58->context_ = pIVar1;
  (local_58->nested_loops_).
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_58->nested_loops_).
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58->loop_latch_ = (BasicBlock *)0x0;
  local_58->parent_ = (Loop *)0x0;
  local_58->loop_merge_ = (BasicBlock *)0x0;
  local_58->loop_preheader_ = (BasicBlock *)0x0;
  local_58->loop_header_ = (BasicBlock *)0x0;
  local_58->loop_continue_ = (BasicBlock *)0x0;
  (local_58->nested_loops_).
  super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_58->loop_basic_blocks_)._M_h._M_buckets =
       &(local_58->loop_basic_blocks_)._M_h._M_single_bucket;
  (local_58->loop_basic_blocks_)._M_h._M_bucket_count = 1;
  (local_58->loop_basic_blocks_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (local_58->loop_basic_blocks_)._M_h._M_element_count = 0;
  (local_58->loop_basic_blocks_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (local_58->loop_basic_blocks_)._M_h._M_rehash_policy._M_next_resize = 0;
  (local_58->loop_basic_blocks_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_58->loop_is_marked_for_removal_ = false;
  if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar1);
  }
  local_38 = (pIVar1->cfg_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
             _M_t.
             super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
             super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  puVar17 = (pointer)(ordered_loop_blocks->
                     super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
  local_70 = (pointer)(ordered_loop_blocks->
                      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar17 != local_70) {
    local_40 = (pointer)&local_a0->cloned_bb_;
    local_48 = (pointer)&local_a0->old_to_new_bb_;
    local_50 = (pointer)&local_a0->new_to_old_bb_;
    local_a8 = (BasicBlock *)&local_a0->value_map_;
    do {
      pLVar7 = local_b0;
      this_00 = (puVar17->_M_t).
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      local_e0 = BasicBlock::Clone(this_00,local_b0->context_);
      local_e0->function_ = pLVar7->function_;
      pIVar21 = (local_e0->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      pIVar1 = pLVar7->context_;
      PVar10.data._M_elems =
           (array<signed_char,_4UL>)
           Module::TakeNextIdBound
                     ((pIVar1->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
      if ((PVar10.data._M_elems == (_Type)0x0) &&
         ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
        local_d8._0_8_ = local_d8 + 0x10;
        local_98.line._0_4_ = (array<signed_char,_4UL>)0x25;
        local_98.line._4_4_ = (array<signed_char,_4UL>)0x0;
        local_d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)&local_98);
        local_d8._16_8_ = local_98.line;
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        _vptr_IntrusiveNodeBase = (_func_int **)0x667265766f204449;
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        next_node_ = (Instruction *)0x797254202e776f6c;
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        previous_node_ = (Instruction *)0x676e696e6e757220;
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        is_sentinel_ = true;
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        field_0x19 = 'c';
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        field_0x1a = 'o';
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        field_0x1b = 'm';
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        field_0x1c = 'p';
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        field_0x1d = 'a';
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        field_0x1e = 'c';
        (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
        field_0x1f = 't';
        *(undefined8 *)
         &(((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          field_0x1d = 0x2e7364692d746361;
        local_d8._8_8_ = local_98.line;
        *(code *)((long)&(((Instruction *)local_d8._0_8_)->
                         super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                         _vptr_IntrusiveNodeBase + local_98.line) = (code)0x0;
        local_98.line = 0;
        local_98.column = 0;
        local_98.index = 0;
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_98,(char *)local_d8._0_8_);
        if ((Instruction *)local_d8._0_8_ != (Instruction *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
        }
      }
      if (pIVar21->has_result_id_ == false) {
LAB_005b6cfe:
        __assert_fail("has_result_id_",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
      }
      if (PVar10.data._M_elems == (_Type)0x0) {
LAB_005b6cdf:
        __assert_fail("res_id != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
      }
      local_d8._0_8_ = &PTR__SmallVector_00b15d78;
      pcStack_c0 = (code *)(local_d8 + 0x10);
      local_b8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_d8._16_4_ = PVar10.data._M_elems;
      local_d8._8_4_ = (array<signed_char,_4UL>)0x1;
      local_d8._12_4_ = (array<signed_char,_4UL>)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 (*(long *)&(pIVar21->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl + (ulong)((uint)pIVar21->has_type_id_ * 0x30) + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_d8);
      local_d8._0_8_ = &PTR__SmallVector_00b15d78;
      if (local_b8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_b8,local_b8._M_head_impl);
      }
      analysis::DefUseManager::AnalyzeInstDef
                (local_60,(local_e0->label_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      pBVar6 = local_e0;
      local_d8._0_8_ =
           (local_e0->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if ((local_b0->context_->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
        ppBVar12 = std::__detail::
                   _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_b0->context_->instr_to_block_,(key_type *)local_d8);
        *ppBVar12 = pBVar6;
      }
      std::
      vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
      ::emplace_back<spvtools::opt::BasicBlock*&>
                ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                  *)local_40,&local_e0);
      pBVar6 = local_e0;
      pIVar21 = (this_00->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar22 = 0;
      uVar11 = 0;
      if (pIVar21->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
      }
      local_d8._0_4_ = uVar11;
      ppBVar13 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)local_48,(key_type *)local_d8);
      *ppBVar13 = pBVar6;
      pIVar21 = (local_e0->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar21->has_result_id_ == true) {
        uVar22 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
      }
      local_d8._0_4_ = uVar22;
      ppBVar13 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)local_50,(key_type *)local_d8);
      *ppBVar13 = this_00;
      pIVar21 = (local_e0->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar22 = 0;
      uVar11 = 0;
      if (pIVar21->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
      }
      pIVar21 = (this_00->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if (pIVar21->has_result_id_ == true) {
        uVar22 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
      }
      local_d8._0_4_ = uVar22;
      pmVar14 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_a8,(key_type *)local_d8);
      *pmVar14 = uVar11;
      pLVar2 = local_b0->loop_;
      pIVar21 = (this_00->label_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar11 = 0;
      if (pIVar21->has_result_id_ == true) {
        uVar11 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
      }
      local_d8._0_4_ = uVar11;
      local_68 = puVar17;
      sVar15 = std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&(pLVar2->loop_basic_blocks_)._M_h,(key_type_conflict *)local_d8);
      if (sVar15 != 0) {
        Loop::AddBasicBlock(local_58,local_e0);
      }
      pIVar21 = (local_e0->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if (pIVar21 != &(local_e0->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_)
      {
        ppIVar19 = (Instruction **)
                   ((long)&(this_00->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                           sentinel_ + 8);
        do {
          this_01 = *ppIVar19;
          local_d8._0_8_ = pIVar21;
          ppIVar16 = std::__detail::
                     _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_a0,(key_type *)local_d8);
          *ppIVar16 = this_01;
          if (pIVar21->has_result_id_ == true) {
            pIVar1 = local_b0->context_;
            PVar10.data._M_elems =
                 (array<signed_char,_4UL>)
                 Module::TakeNextIdBound
                           ((pIVar1->module_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                            .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
            if ((PVar10.data._M_elems == (_Type)0x0) &&
               ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
              local_d8._0_8_ = local_d8 + 0x10;
              local_98.line._0_4_ = (array<signed_char,_4UL>)0x25;
              local_98.line._4_4_ = (array<signed_char,_4UL>)0x0;
              local_d8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_d8,(ulong)&local_98);
              local_d8._16_8_ = local_98.line;
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              ._vptr_IntrusiveNodeBase = (_func_int **)0x667265766f204449;
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .next_node_ = (Instruction *)0x797254202e776f6c;
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .previous_node_ = (Instruction *)0x676e696e6e757220;
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .is_sentinel_ = true;
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .field_0x19 = 'c';
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .field_0x1a = 'o';
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .field_0x1b = 'm';
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .field_0x1c = 'p';
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .field_0x1d = 'a';
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .field_0x1e = 'c';
              (((Instruction *)local_d8._0_8_)->super_IntrusiveNodeBase<spvtools::opt::Instruction>)
              .field_0x1f = 't';
              *(undefined8 *)
               &(((Instruction *)local_d8._0_8_)->
                super_IntrusiveNodeBase<spvtools::opt::Instruction>).field_0x1d = 0x2e7364692d746361
              ;
              local_d8._8_8_ = local_98.line;
              *(code *)((long)&(((Instruction *)local_d8._0_8_)->
                               super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                               _vptr_IntrusiveNodeBase + local_98.line) = (code)0x0;
              local_98.line = 0;
              local_98.column = 0;
              local_98.index = 0;
              std::
              function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
              ::operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",&local_98,(char *)local_d8._0_8_);
              if ((Instruction *)local_d8._0_8_ != (Instruction *)(local_d8 + 0x10)) {
                operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
              }
            }
            if (pIVar21->has_result_id_ == false) goto LAB_005b6cfe;
            if (PVar10.data._M_elems == (_Type)0x0) goto LAB_005b6cdf;
            local_d8._0_8_ = &PTR__SmallVector_00b15d78;
            pcStack_c0 = (code *)(local_d8 + 0x10);
            local_b8._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_d8._16_4_ = PVar10.data._M_elems;
            local_d8._8_4_ = (array<signed_char,_4UL>)0x1;
            local_d8._12_4_ = (array<signed_char,_4UL>)0x0;
            utils::SmallVector<unsigned_int,_2UL>::operator=
                      ((SmallVector<unsigned_int,_2UL> *)
                       ((long)((((pIVar21->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                              0xfffffffffffffffc) + (ulong)((uint)pIVar21->has_type_id_ * 0x30)),
                       (SmallVector<unsigned_int,_2UL> *)local_d8);
            local_d8._0_8_ = &PTR__SmallVector_00b15d78;
            if (local_b8._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0)
            {
              std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
              operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)&local_b8,local_b8._M_head_impl);
            }
            uVar22 = 0;
            uVar11 = 0;
            if (pIVar21->has_result_id_ == true) {
              uVar11 = Instruction::GetSingleWordOperand(pIVar21,(uint)pIVar21->has_type_id_);
            }
            if (this_01->has_result_id_ == true) {
              uVar22 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
            }
            local_d8._0_4_ = uVar22;
            pmVar14 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)local_a8,(key_type *)local_d8);
            *pmVar14 = uVar11;
            analysis::DefUseManager::AnalyzeInstDef(local_60,pIVar21);
          }
          ppIVar19 = &(this_01->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          pIVar21 = (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        } while (pIVar21 !=
                 &(local_e0->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
      }
      puVar17 = local_68 + 1;
    } while (puVar17 != local_70);
  }
  puVar17 = (local_a0->cloned_bb_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (local_a0->cloned_bb_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar17 != local_70) {
    do {
      local_a8 = (puVar17->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                 .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      pIVar5 = &local_a8->insts_;
      local_68 = puVar17;
      for (pIVar21 = *(Instruction **)
                      ((long)&(local_a8->insts_).super_IntrusiveList<spvtools::opt::Instruction> +
                      0x10);
          pIVar21 !=
          (Instruction *)((long)&pIVar5->super_IntrusiveList<spvtools::opt::Instruction> + 8U);
          pIVar21 = (pIVar21->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        local_98.column = 0;
        local_98.line = (size_t)local_a0;
        pcStack_80 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:598:24)>
                     ::_M_invoke;
        local_98.index =
             (size_t)std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:598:24)>
                     ::_M_manager;
        local_d8._8_4_ = (array<signed_char,_4UL>)0x0;
        local_d8._12_4_ = (array<signed_char,_4UL>)0x0;
        local_d8._0_8_ = &local_98;
        pcStack_c0 = std::
                     _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                     ::_M_invoke;
        local_d8._16_8_ =
             std::
             _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
             ::_M_manager;
        pOVar3 = (pIVar21->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pOVar20 = (pIVar21->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start; pOVar20 != pOVar3;
            pOVar20 = pOVar20 + 1) {
          bVar8 = spvIsInIdType(pOVar20->type);
          if (bVar8) {
            ppuVar4 = (uint **)(pOVar20->words).large_data_._M_t.
                               super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               .
                               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                               ._M_head_impl;
            ppuVar18 = &(pOVar20->words).small_data_;
            if (ppuVar4 != (uint **)0x0) {
              ppuVar18 = ppuVar4;
            }
            local_e0 = (BasicBlock *)*ppuVar18;
            if ((PodType  [2])local_d8._16_8_ == (PodType  [2])0x0) {
              std::__throw_bad_function_call();
            }
            cVar9 = (*pcStack_c0)(local_d8,&local_e0);
            if (cVar9 == '\0') break;
          }
        }
        if ((PodType  [2])local_d8._16_8_ != (PodType  [2])0x0) {
          (*(code *)local_d8._16_8_)(local_d8,local_d8,3);
        }
        if ((Instruction *)local_98.index != (Instruction *)0x0) {
          (*(code *)local_98.index)(&local_98,&local_98,3);
        }
        analysis::DefUseManager::AnalyzeInstUse(local_60,pIVar21);
        local_d8._0_8_ = pIVar21;
        if ((local_b0->context_->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
          ppBVar12 = std::__detail::
                     _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_b0->context_->instr_to_block_,(key_type *)local_d8);
          *ppBVar12 = local_a8;
        }
      }
      CFG::RegisterBlock(local_38,local_a8);
      puVar17 = local_68 + 1;
    } while (puVar17 != local_70);
  }
  pLVar2 = local_58;
  PopulateLoopNest(local_b0,local_58,local_a0);
  return pLVar2;
}

Assistant:

Loop* LoopUtils::CloneLoop(
    LoopCloningResult* cloning_result,
    const std::vector<BasicBlock*>& ordered_loop_blocks) const {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

  std::unique_ptr<Loop> new_loop = MakeUnique<Loop>(context_);

  CFG& cfg = *context_->cfg();

  // Clone and place blocks in a SPIR-V compliant order (dominators first).
  for (BasicBlock* old_bb : ordered_loop_blocks) {
    // For each basic block in the loop, we clone it and register the mapping
    // between old and new ids.
    BasicBlock* new_bb = old_bb->Clone(context_);
    new_bb->SetParent(&function_);
    // TODO(1841): Handle id overflow.
    new_bb->GetLabelInst()->SetResultId(context_->TakeNextId());
    def_use_mgr->AnalyzeInstDef(new_bb->GetLabelInst());
    context_->set_instr_block(new_bb->GetLabelInst(), new_bb);
    cloning_result->cloned_bb_.emplace_back(new_bb);

    cloning_result->old_to_new_bb_[old_bb->id()] = new_bb;
    cloning_result->new_to_old_bb_[new_bb->id()] = old_bb;
    cloning_result->value_map_[old_bb->id()] = new_bb->id();

    if (loop_->IsInsideLoop(old_bb)) new_loop->AddBasicBlock(new_bb);

    for (auto new_inst = new_bb->begin(), old_inst = old_bb->begin();
         new_inst != new_bb->end(); ++new_inst, ++old_inst) {
      cloning_result->ptr_map_[&*new_inst] = &*old_inst;
      if (new_inst->HasResultId()) {
        // TODO(1841): Handle id overflow.
        new_inst->SetResultId(context_->TakeNextId());
        cloning_result->value_map_[old_inst->result_id()] =
            new_inst->result_id();

        // Only look at the defs for now, uses are not updated yet.
        def_use_mgr->AnalyzeInstDef(&*new_inst);
      }
    }
  }

  // All instructions (including all labels) have been cloned,
  // remap instruction operands id with the new ones.
  for (std::unique_ptr<BasicBlock>& bb_ref : cloning_result->cloned_bb_) {
    BasicBlock* bb = bb_ref.get();

    for (Instruction& insn : *bb) {
      insn.ForEachInId([cloning_result](uint32_t* old_id) {
        // If the operand is defined in the loop, remap the id.
        auto id_it = cloning_result->value_map_.find(*old_id);
        if (id_it != cloning_result->value_map_.end()) {
          *old_id = id_it->second;
        }
      });
      // Only look at what the instruction uses. All defs are register, so all
      // should be fine now.
      def_use_mgr->AnalyzeInstUse(&insn);
      context_->set_instr_block(&insn, bb);
    }
    cfg.RegisterBlock(bb);
  }

  PopulateLoopNest(new_loop.get(), *cloning_result);

  return new_loop.release();
}